

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void new_range(int ndim,int *dims,int *lo,int *hi,int *new_lo,int *new_hi)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__assertion;
  int iVar5;
  uint uVar6;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)ndim;
  if (ndim < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      return;
    }
    iVar2 = lo[uVar3];
    uVar6 = hi[uVar3] - iVar2;
    if (dims[uVar3] <= (int)uVar6) {
      __assertion = "diff <= dims[dim]";
      uVar6 = 0x5e;
      goto LAB_00103a21;
    }
    iVar5 = dims[uVar3] + ~uVar6;
    if (0 < iVar5) {
      iVar2 = rand();
      iVar2 = iVar2 % iVar5;
    }
    new_lo[uVar3] = iVar2;
    iVar2 = iVar2 + uVar6;
    new_hi[uVar3] = iVar2;
    if (dims[uVar3] <= iVar2) {
      __assertion = "new_hi[dim] < dims[dim]";
      uVar6 = 99;
      goto LAB_00103a21;
    }
    piVar1 = new_lo + uVar3;
    uVar3 = uVar3 + 1;
  } while (uVar6 == iVar2 - *piVar1);
  __assertion = "diff == (new_hi[dim] -new_lo[dim]+1)";
  uVar6 = 100;
LAB_00103a21:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,uVar6,"void new_range(int, int *, int *, int *, int *, int *)");
}

Assistant:

void new_range(int ndim, int dims[], int lo[], int hi[],
                             int new_lo[], int new_hi[])
{
    int dim;
    for(dim=0; dim <ndim;dim++){
        int toss, range;
        int diff = hi[dim] -lo[dim]+1;
        assert(diff <= dims[dim]);
                range = dims[dim]-diff;
                toss = (range > 0)? rand()%range : lo[dim];
        new_lo[dim] = toss;
        new_hi[dim] = toss + diff -1;
        assert(new_hi[dim] < dims[dim]);
        assert(diff == (new_hi[dim] -new_lo[dim]+1));
    }
}